

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<unsigned_int&,char_const(&)[16]>
          (String *__return_storage_ptr__,kj *this,uint *params,char (*params_1) [16])

{
  undefined1 local_40 [40];
  
  _::Stringifier::operator*
            ((CappedArray<char,_14UL> *)(local_40 + 0x10),(Stringifier *)&_::STR,*(uint *)this);
  local_40._8_8_ = strlen((char *)params);
  local_40._0_8_ = params;
  _::concat<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)(local_40 + 0x10),(CappedArray<char,_14UL> *)local_40,
             (ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}